

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

op_t * get_new_temp(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,MIR_type_t t)

{
  int iVar1;
  MIR_context_t ctx;
  reg_var_t rVar2;
  char reg_name [50];
  char acStack_68 [64];
  
  if (t - MIR_T_I32 < 7) {
    ctx = c2m_ctx->ctx;
    iVar1 = *(int *)(&DAT_001be6bc + (ulong)(t - MIR_T_I32) * 4);
    c2m_ctx->gen_ctx->reg_free_mark = c2m_ctx->gen_ctx->reg_free_mark + 1;
    sprintf(acStack_68,&DAT_001be6bc + iVar1);
    rVar2 = get_reg_var(c2m_ctx,t,acStack_68,(char *)0x0);
    MIR_new_reg_op(ctx,(MIR_reg_t)rVar2.name);
    __return_storage_ptr__->decl = (decl_t)0x0;
    return __return_storage_ptr__;
  }
  __assert_fail("t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_F || t == MIR_T_D || t == MIR_T_LD"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2813,"op_t get_new_temp(c2m_ctx_t, MIR_type_t)");
}

Assistant:

static op_t get_new_temp (c2m_ctx_t c2m_ctx, MIR_type_t t) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  char reg_name[50];
  MIR_reg_t reg;

  assert (t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_F
          || t == MIR_T_D || t == MIR_T_LD);
  sprintf (reg_name,
           t == MIR_T_I64   ? "I_%u"
           : t == MIR_T_U64 ? "U_%u"
           : t == MIR_T_I32 ? "i_%u"
           : t == MIR_T_U32 ? "u_%u"
           : t == MIR_T_F   ? "f_%u"
           : t == MIR_T_D   ? "d_%u"
                            : "D_%u",
           reg_free_mark++);
  reg = get_reg_var (c2m_ctx, t, reg_name, NULL).reg;
  return new_op (NULL, MIR_new_reg_op (ctx, reg));
}